

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeRefI31
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Shareability share)

{
  RefI31 *pRVar1;
  bool bVar2;
  Ok local_9d;
  uint local_9c;
  Err local_98;
  Err *local_68;
  Err *err;
  Result<wasm::Ok> _val;
  RefI31 curr;
  Shareability share_local;
  IRBuilder *this_local;
  
  pRVar1 = (RefI31 *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  RefI31::RefI31(pRVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitRefI31
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pRVar1);
  local_68 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_68 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_98,local_68);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_98);
    wasm::Err::~Err(&local_98);
  }
  local_9c = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_9c == 0) {
    pRVar1 = Builder::makeRefI31(&this->builder,
                                 (Expression *)
                                 curr.super_SpecificExpression<(wasm::Expression::Id)59>.
                                 super_Expression.type.id,share);
    push(this,(Expression *)pRVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_9d);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeRefI31(Shareability share) {
  RefI31 curr;
  CHECK_ERR(visitRefI31(&curr));
  push(builder.makeRefI31(curr.value, share));
  return Ok{};
}